

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcache.c
# Opt level: O2

byte_req_pair memcache_ascii_consume_response(application_protocol *proto,iovec *resp)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  char *__s1;
  uint uVar7;
  ulong uVar8;
  byte_req_pair bVar9;
  
  pvVar1 = resp->iov_base;
  uVar2 = resp->iov_len;
  uVar5 = 0;
  uVar8 = uVar2 & 0xffffffff;
  uVar6 = 0;
  while (uVar7 = (uint)uVar8, 4 < (int)uVar7) {
    __s1 = (char *)((uVar2 - uVar8) + (long)pvVar1);
    iVar3 = strncmp(__s1,"END\r\n",5);
    if (iVar3 == 0) {
      uVar5 = uVar5 + 5;
      uVar8 = (ulong)(uVar7 - 5);
    }
    else {
      if (uVar7 < 8) break;
      iVar3 = strncmp(__s1,"STORED\r\n",8);
      if (iVar3 == 0) {
        uVar5 = uVar5 + 8;
        uVar8 = (ulong)(uVar7 - 8);
      }
      else {
        pcVar4 = __s1 + -1;
        iVar3 = 4;
        while (iVar3 = iVar3 + -1, iVar3 != 0) {
          pcVar4 = strchr(pcVar4 + 1,10);
          if (pcVar4 == (char *)0x0) goto LAB_00107e59;
        }
        iVar3 = ((int)pcVar4 - (int)__s1) + 1;
        uVar8 = (ulong)(uVar7 - iVar3);
        uVar5 = uVar5 + (long)iVar3;
      }
    }
    uVar6 = uVar6 + 1;
  }
LAB_00107e59:
  bVar9.reqs = uVar6;
  bVar9.bytes = uVar5;
  return bVar9;
}

Assistant:

static struct byte_req_pair
memcache_ascii_consume_response(struct application_protocol *proto,
								struct iovec *resp)
{
	struct byte_req_pair res;
	int bytes_to_process, get_rep_size;
	char *buf, *ptr;

	res.bytes = 0;
	res.reqs = 0;
	bytes_to_process = resp->iov_len;
	buf = resp->iov_base;

	while (bytes_to_process) {
		if (bytes_to_process < 5) // minimum reply is EDN\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "END\r\n", 5) ==
			0) {
			// key not found
			res.bytes += 5;
			res.reqs += 1;
			bytes_to_process -= 5;
			continue;
		}
		if (bytes_to_process < 8) // try STORED\r\n
			goto OUT;
		if (strncmp(&buf[resp->iov_len - bytes_to_process], "STORED\r\n", 8) ==
			0) {
			// successful set
			res.bytes += 8;
			res.reqs += 1;
			bytes_to_process -= 8;
			continue;
		}
		// try for get reply - look for 3 \n
		ptr = strchnth(&buf[resp->iov_len - bytes_to_process], '\n', 3);
		if (!ptr)
			goto OUT;
		get_rep_size = ptr - &buf[resp->iov_len - bytes_to_process] + 1;
		bytes_to_process -= get_rep_size;
		res.bytes += get_rep_size;
		res.reqs += 1;
	}

OUT:
	return res;
}